

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O0

PyTypeObject * pybind11::detail::make_static_property_type(void)

{
  PyTypeObject *pPVar1;
  int iVar2;
  PyObject *pPVar3;
  handle *phVar4;
  handle local_58;
  PyObject *local_50;
  handle local_48;
  PyTypeObject *local_40;
  PyTypeObject *type;
  PyTypeObject *local_28;
  PyHeapTypeObject *heap_type;
  handle local_18;
  object name_obj;
  char *name;
  
  name_obj.super_handle.m_ptr = (handle)anon_var_dwarf_1da86;
  pPVar3 = (PyObject *)PyUnicode_FromString();
  handle::handle((handle *)&heap_type,pPVar3);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_18,(handle)heap_type);
  local_28 = (PyTypeObject *)(*__runtime_error)(&PyType_Type,0);
  if (local_28 == (PyTypeObject *)0x0) {
    pybind11_fail("make_static_property_type(): error allocating type!");
  }
  phVar4 = handle::inc_ref(&local_18);
  pPVar3 = handle::ptr(phVar4);
  local_28[2].tp_basicsize = (Py_ssize_t)pPVar3;
  phVar4 = handle::inc_ref(&local_18);
  pPVar3 = handle::ptr(phVar4);
  local_28[2].tp_dealloc = (destructor)pPVar3;
  local_40 = local_28;
  local_28->tp_name = "pybind11_static_property";
  local_28->tp_base = (_typeobject *)&PyProperty_Type;
  local_28->tp_flags = 0x600;
  local_28->tp_descr_get = pybind11_static_get;
  local_28->tp_descr_set = pybind11_static_set;
  iVar2 = PyType_Ready(local_28);
  if (iVar2 < 0) {
    pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");
  }
  handle::handle(&local_48,(PyObject *)local_40);
  str::str((str *)&local_58,"pybind11_builtins");
  local_50 = local_58.m_ptr;
  setattr(local_48,"__module__",local_58);
  str::~str((str *)&local_58);
  pPVar1 = local_40;
  object::~object((object *)&local_18);
  return pPVar1;
}

Assistant:

inline PyTypeObject *make_static_property_type() {
    constexpr auto *name = "pybind11_static_property";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type)
        pybind11_fail("make_static_property_type(): error allocating type!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = &PyProperty_Type;
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
    type->tp_descr_get = pybind11_static_get;
    type->tp_descr_set = pybind11_static_set;

    if (PyType_Ready(type) < 0)
        pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));

    return type;
}